

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLinLin>
                 *this,GetterXsYs<signed_char> *getter1,GetterXsYs<signed_char> *getter2,
                TransformerLinLin *transformer,ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  ImPlotContext *pIVar3;
  int iVar4;
  long lVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar4 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar4 = iVar2;
  }
  this->Prims = iVar4 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  pIVar3 = GImPlot;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  (this->P12).y = 0.0;
  lVar5 = (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride;
  iVar2 = transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar2].Min;
  IVar7.x = (float)(GImPlot->Mx *
                    ((double)(int)getter1->Xs[lVar5] - (GImPlot->CurrentPlot->XAxis).Range.Min) +
                   (double)IVar1.x);
  IVar7.y = (float)(GImPlot->My[iVar2] *
                    ((double)(int)((long)((ulong)(byte)getter1->Ys[lVar5] << 0x38) >> 0x38) -
                    GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y);
  this->P11 = IVar7;
  iVar2 = getter2->Count;
  lVar5 = (long)((getter2->Offset % iVar2 + iVar2) % iVar2) * (long)getter2->Stride;
  iVar2 = transformer->YAxis;
  IVar1 = pIVar3->PixelRange[iVar2].Min;
  IVar6.x = (float)(pIVar3->Mx *
                    ((double)(int)getter2->Xs[lVar5] - (pIVar3->CurrentPlot->XAxis).Range.Min) +
                   (double)IVar1.x);
  IVar6.y = (float)(pIVar3->My[iVar2] *
                    ((double)(int)((long)((ulong)(byte)getter2->Ys[lVar5] << 0x38) >> 0x38) -
                    pIVar3->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y);
  this->P12 = IVar6;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }